

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Maybe<kj::Own<kj::AppendableFile,_std::nullptr_t>_> __thiscall
kj::anon_unknown_9::DiskDirectory::tryAppendFile(DiskDirectory *this,PathPtr path,WriteMode mode)

{
  Maybe<kj::Own<kj::AppendableFile,_std::nullptr_t>_> MVar1;
  PathPtr path_00;
  WriteMode mode_local;
  DiskDirectory *this_local;
  PathPtr path_local;
  
  path_00.parts.size_ = path.parts.size_;
  path_00.parts.ptr = &((path.parts.ptr)->content).size_;
  MVar1 = DiskHandle::tryAppendFile((DiskHandle *)this,path_00,mode);
  MVar1.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::AppendableFile,_std::nullptr_t>_>)MVar1.ptr;
}

Assistant:

Maybe<Own<AppendableFile>> tryAppendFile(PathPtr path, WriteMode mode) const override {
    return DiskHandle::tryAppendFile(path, mode);
  }